

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_box_sphere(rf_bounding_box box,rf_vec3 center,float radius)

{
  float fVar1;
  float fVar2;
  float local_30;
  float dmin;
  _Bool collision;
  float radius_local;
  float local_14;
  float fStack_10;
  rf_vec3 center_local;
  
  fVar2 = center.z;
  local_30 = 0.0;
  local_14 = center.x;
  if (box.min.x <= local_14) {
    if (box.max.x < local_14) {
      local_30 = powf(local_14 - box.max.x,2.0);
      local_30 = local_30 + 0.0;
    }
  }
  else {
    local_30 = powf(local_14 - box.min.x,2.0);
    local_30 = local_30 + 0.0;
  }
  fStack_10 = center.y;
  if (box.min.y <= fStack_10) {
    if (box.max.y < fStack_10) {
      fVar1 = powf(fStack_10 - box.max.y,2.0);
      local_30 = fVar1 + local_30;
    }
  }
  else {
    fVar1 = powf(fStack_10 - box.min.y,2.0);
    local_30 = fVar1 + local_30;
  }
  if (box.min.z <= fVar2) {
    if (box.max.z < fVar2) {
      fVar2 = powf(fVar2 - box.max.z,2.0);
      local_30 = fVar2 + local_30;
    }
  }
  else {
    fVar2 = powf(fVar2 - box.min.z,2.0);
    local_30 = fVar2 + local_30;
  }
  return local_30 <= radius * radius;
}

Assistant:

RF_API bool rf_check_collision_box_sphere(rf_bounding_box box, rf_vec3 center, float radius)
{
    bool collision = false;

    float dmin = 0;

    if (center.x < box.min.x) dmin += powf(center.x - box.min.x, 2);
    else if (center.x > box.max.x) dmin += powf(center.x - box.max.x, 2);

    if (center.y < box.min.y) dmin += powf(center.y - box.min.y, 2);
    else if (center.y > box.max.y) dmin += powf(center.y - box.max.y, 2);

    if (center.z < box.min.z) dmin += powf(center.z - box.min.z, 2);
    else if (center.z > box.max.z) dmin += powf(center.z - box.max.z, 2);

    if (dmin <= (radius * radius)) collision = true;

    return collision;
}